

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_strings.cpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::string_mapping::add_string
          (string_mapping *this,not_null<transaction_base_*> transaction,string *str)

{
  size_t *psVar1;
  uint uVar2;
  _Node *p_Var3;
  _List_node_base *p_Var4;
  error_category *peVar5;
  error_code eVar6;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  names_index;
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  add_res;
  size_type local_160;
  index local_158 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _List_node_base *local_148;
  _List_node_base *p_Stack_140;
  value_type local_130;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_128;
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  local_120;
  
  p_Var3 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           _M_create_node<std::__cxx11::string_const&>
                     ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                      &this->strings_,str);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(this->strings_).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (this->strings_).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  local_148 = p_Var4[1]._M_next;
  p_Stack_140 = p_Var4[1]._M_prev;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  p_Var4[1]._M_next = local_148;
  p_Var4[1]._M_prev = p_Stack_140;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->views_).
            super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (this->views_).
           super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            (local_158,(transaction.ptr_)->db_,true);
  local_128.ptr_ = (sstring_view<const_char_*> *)(p_Var4 + 1);
  gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant(&local_128);
  indirect_string_adder::
  add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            (&local_120,&this->adder_,transaction.ptr_,
             (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
              *)local_158,local_128);
  if (local_120.second == false) {
    eVar6 = make_error_code(duplicate_name);
    peVar5 = eVar6._M_cat;
    uVar2 = eVar6._M_value;
  }
  else {
    local_160 = (this->lookup_)._M_h._M_element_count;
    local_130 = (value_type)
                index::
                hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                ::iterator_base<true>::get_address((iterator_base<true> *)&local_120);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>,std::allocator<std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long,pstore::typed_address<pstore::indirect_string>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>,std::allocator<std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->lookup_,&local_160);
    uVar2 = 0;
    peVar5 = (error_category *)std::_V2::system_category();
  }
  if ((_Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
       )local_120.first.it_.pos_._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
        ._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
       )0x0) {
    operator_delete((void *)local_120.first.it_.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
                            ._M_head_impl,0x20);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  eVar6._4_4_ = 0;
  eVar6._M_value = uVar2;
  eVar6._M_cat = peVar5;
  return eVar6;
}

Assistant:

std::error_code
            string_mapping::add_string (not_null<transaction_base *> const transaction,
                                        std::string const & str) {
                strings_.push_back (str);
                std::string const & x = strings_.back ();

                views_.emplace_back (make_sstring_view (x));
                auto & s = views_.back ();

                std::shared_ptr<index::name_index> const names_index =
                    index::get_index<trailer::indices::name> (transaction->db ());
                std::pair<index::name_index::iterator, bool> const add_res =
                    adder_.add (*transaction, names_index, &s);
                if (!add_res.second) {
                    return error::duplicate_name;
                }

                lookup_.emplace (lookup_.size (), typed_address<indirect_string>::make (
                                                      add_res.first.get_address ()));
                return {};
            }